

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcd.c
# Opt level: O1

OPJ_UINT32
opj_tcd_get_decoded_tile_size(opj_tcd_t *p_tcd,OPJ_BOOL take_into_account_partial_decoding)

{
  opj_tcd_resolution_t *poVar1;
  bool bVar2;
  ulong uVar3;
  uint uVar4;
  opj_tcd_resolution_t *poVar5;
  opj_tcd_tilecomp_t *poVar6;
  uint uVar7;
  uint uVar8;
  OPJ_UINT32 *pOVar9;
  OPJ_UINT32 OVar10;
  opj_image_comp_t *poVar11;
  uint uVar12;
  long lVar13;
  long lVar14;
  
  OVar10 = p_tcd->image->numcomps;
  if (OVar10 == 0) {
    uVar4 = 0;
  }
  else {
    poVar11 = p_tcd->image->comps;
    poVar6 = p_tcd->tcd_image->tiles->comps;
    uVar4 = 0;
    do {
      uVar7 = ((poVar11->prec >> 3) + 1) - (uint)((poVar11->prec & 7) == 0);
      if (uVar7 == 3) {
        uVar7 = 4;
      }
      poVar1 = poVar6->resolutions;
      uVar3 = (ulong)poVar6->minimum_num_resolutions;
      if ((take_into_account_partial_decoding == 0) || (p_tcd->whole_tile_decoding != 0)) {
        poVar5 = poVar1 + (uVar3 - 1);
        pOVar9 = (OPJ_UINT32 *)&poVar1[uVar3 - 1].x1;
        lVar14 = -0xbc;
        lVar13 = -0xb4;
      }
      else {
        pOVar9 = &poVar1[uVar3 - 1].win_x1;
        poVar5 = (opj_tcd_resolution_t *)&poVar1[uVar3 - 1].win_x0;
        lVar14 = -0xc;
        lVar13 = -4;
      }
      uVar8 = *pOVar9 - poVar5->x0;
      uVar12 = *(int *)((long)poVar1[uVar3].bands + lVar13 + -0x20) -
               *(int *)((long)poVar1[uVar3].bands + lVar14 + -0x20);
      if ((((uVar12 != 0) && ((int)((ulong)uVar8 * (ulong)uVar12 >> 0x20) != 0)) ||
          ((uVar12 = uVar12 * uVar8, uVar7 != 0 &&
           ((int)((ulong)uVar7 * (ulong)uVar12 >> 0x20) != 0)))) ||
         (uVar12 = uVar12 * uVar7, CARRY4(uVar12,uVar4))) {
        bVar2 = false;
      }
      else {
        poVar11 = poVar11 + 1;
        poVar6 = poVar6 + 1;
        bVar2 = true;
        uVar4 = uVar12 + uVar4;
      }
      if (!bVar2) {
        return 0xffffffff;
      }
      OVar10 = OVar10 - 1;
    } while (OVar10 != 0);
  }
  return uVar4;
}

Assistant:

OPJ_UINT32 opj_tcd_get_decoded_tile_size(opj_tcd_t *p_tcd,
        OPJ_BOOL take_into_account_partial_decoding)
{
    OPJ_UINT32 i;
    OPJ_UINT32 l_data_size = 0;
    opj_image_comp_t * l_img_comp = 00;
    opj_tcd_tilecomp_t * l_tile_comp = 00;
    opj_tcd_resolution_t * l_res = 00;
    OPJ_UINT32 l_size_comp, l_remaining;
    OPJ_UINT32 l_temp;

    l_tile_comp = p_tcd->tcd_image->tiles->comps;
    l_img_comp = p_tcd->image->comps;

    for (i = 0; i < p_tcd->image->numcomps; ++i) {
        OPJ_UINT32 w, h;
        l_size_comp = l_img_comp->prec >> 3; /*(/ 8)*/
        l_remaining = l_img_comp->prec & 7;  /* (%8) */

        if (l_remaining) {
            ++l_size_comp;
        }

        if (l_size_comp == 3) {
            l_size_comp = 4;
        }

        l_res = l_tile_comp->resolutions + l_tile_comp->minimum_num_resolutions - 1;
        if (take_into_account_partial_decoding && !p_tcd->whole_tile_decoding) {
            w = l_res->win_x1 - l_res->win_x0;
            h = l_res->win_y1 - l_res->win_y0;
        } else {
            w = (OPJ_UINT32)(l_res->x1 - l_res->x0);
            h = (OPJ_UINT32)(l_res->y1 - l_res->y0);
        }
        if (h > 0 && UINT_MAX / w < h) {
            return UINT_MAX;
        }
        l_temp = w * h;
        if (l_size_comp && UINT_MAX / l_size_comp < l_temp) {
            return UINT_MAX;
        }
        l_temp *= l_size_comp;

        if (l_temp > UINT_MAX - l_data_size) {
            return UINT_MAX;
        }
        l_data_size += l_temp;
        ++l_img_comp;
        ++l_tile_comp;
    }

    return l_data_size;
}